

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_blob_detection.cpp
# Opt level: O0

bool blob_detection::Detect1Blob(void)

{
  BlobParameters parameter;
  bool bVar1;
  uint32_t uVar2;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *pvVar3;
  size_type sVar4;
  size_t sVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  uint32_t contour;
  BlobDetection detection;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image image;
  uint32_t i;
  undefined1 auVar11 [33];
  undefined1 auVar12 [41];
  undefined1 auVar13 [25];
  BlobParameters *this;
  undefined1 in_stack_fffffffffffffdb8 [64];
  uint local_158;
  undefined1 auVar14 [64];
  undefined8 uStack_e8;
  undefined8 uVar15;
  undefined1 auVar16 [48];
  undefined1 auVar17 [16];
  undefined1 in_stack_ffffffffffffff68 [36];
  uint32_t in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c [20];
  uint local_8;
  byte local_1;
  
  local_8 = 0;
  while( true ) {
    auVar12 = in_stack_fffffffffffffdb8._8_41_;
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= local_8) break;
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (auVar12._16_8_,auVar12._12_4_,auVar12._8_4_,auVar12[7],auVar12[6]);
    auVar11 = auVar12._8_33_;
    Unit_Test::blackImage(auVar12._0_8_);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x185dbc);
    auVar13 = auVar11._8_25_;
    Unit_Test::generateRoi
              (auVar11._24_8_,auVar11._16_8_,auVar11._8_8_,auVar11._0_8_,(uint32_t *)0x185de9);
    Test_Helper::randomValue<unsigned_char>(auVar13[6],auVar13._0_4_);
    this = auVar13._1_8_;
    Unit_Test::fillImage
              (auVar13._17_8_,auVar13._13_4_,auVar13._9_4_,auVar13._5_4_,auVar13._1_4_,auVar13[0]);
    Blob_Detection::BlobDetection::BlobDetection((BlobDetection *)0x185e7f);
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    auVar14 = vmovdqu64_avx512f(auVar10);
    auVar17 = auVar14._48_16_;
    auVar14 = vmovdqu64_avx512f(auVar10);
    uStack_e8 = auVar14._0_8_;
    uVar15 = auVar14._8_8_;
    auVar16 = auVar14._16_48_;
    auVar14 = vmovdqu64_avx512f(auVar10);
    Blob_Detection::BlobParameters::BlobParameters(this);
    auVar8 = vmovdqu64_avx512f(auVar14);
    auVar10._8_8_ = uVar15;
    auVar10._0_8_ = uStack_e8;
    auVar10._16_48_ = auVar16;
    auVar10 = vmovdqu64_avx512f(auVar10);
    auVar9._48_16_ = auVar17;
    auVar9._0_48_ = auVar16;
    auVar9 = vmovdqu64_avx512f(auVar9);
    vmovdqu64_avx512f(auVar9);
    vmovdqu64_avx512f(auVar10);
    in_stack_fffffffffffffdb8 = vmovdqu64_avx512f(auVar8);
    parameter.circularity.checkMinimum = (bool)auVar16[0];
    parameter.circularity._9_7_ = auVar16._1_7_;
    parameter.circularity.maximum = (double)auVar16._8_8_;
    parameter.circularity.checkMaximum = (bool)auVar16[0x10];
    parameter.circularity._25_7_ = auVar16._17_7_;
    parameter.elongation.minimum = (double)auVar16._24_8_;
    parameter.elongation.checkMinimum = (bool)auVar16[0x20];
    parameter.elongation._9_7_ = auVar16._33_7_;
    parameter.elongation.maximum = (double)auVar16._40_8_;
    parameter.circularity.minimum = (double)uVar15;
    parameter.elongation.checkMaximum = (bool)auVar17[0];
    parameter.elongation._25_7_ = auVar17._1_7_;
    parameter.height.minimum = auVar17._8_4_;
    parameter.height.checkMinimum = (bool)auVar17[0xc];
    parameter.height._5_3_ = auVar17._13_3_;
    parameter.height.maximum = in_stack_ffffffffffffff68._0_4_;
    parameter.height.checkMaximum = (bool)in_stack_ffffffffffffff68[4];
    parameter.height._13_3_ = in_stack_ffffffffffffff68._5_3_;
    parameter.length.minimum = (double)in_stack_ffffffffffffff68._8_8_;
    parameter.length.checkMinimum = (bool)in_stack_ffffffffffffff68[0x10];
    parameter.length._9_7_ = in_stack_ffffffffffffff68._17_7_;
    parameter.length.maximum = (double)in_stack_ffffffffffffff68._24_8_;
    parameter.length.checkMaximum = (bool)in_stack_ffffffffffffff68[0x20];
    parameter.length._25_3_ = in_stack_ffffffffffffff68._33_3_;
    parameter.length._28_4_ = in_stack_ffffffffffffff8c;
    parameter.size.minimum = in_stack_ffffffffffffff90;
    parameter.size._4_4_ = in_stack_ffffffffffffff94;
    parameter.size.maximum = in_stack_ffffffffffffff98;
    auVar17 = in_stack_ffffffffffffff9c._4_16_;
    parameter.size.checkMaximum = (bool)in_stack_ffffffffffffff9c[0];
    parameter.size._13_3_ = in_stack_ffffffffffffff9c._1_3_;
    parameter.width.minimum = auVar17._0_4_;
    parameter.width.checkMinimum = (bool)auVar17[4];
    parameter.width._5_3_ = auVar17._5_3_;
    parameter.width.maximum = auVar17._8_4_;
    parameter.width.checkMaximum = (bool)auVar17[0xc];
    parameter.width._13_3_ = auVar17._13_3_;
    Blob_Detection::BlobDetection::find(auVar14._56_8_,auVar14._48_8_,parameter,auVar14[0x2f]);
    if ((in_stack_ffffffffffffff90 < 2) || (in_stack_ffffffffffffff8c < 3)) {
      local_158 = in_stack_ffffffffffffff90 * in_stack_ffffffffffffff8c;
    }
    else {
      local_158 = in_stack_ffffffffffffff90 * 2 + (in_stack_ffffffffffffff8c - 2) * 2;
    }
    pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)&stack0xffffffffffffff70);
    sVar4 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::size
                      (pvVar3);
    if (sVar4 == 1) {
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)&stack0xffffffffffffff70);
      std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::operator[]
                (pvVar3,0);
      uVar2 = Blob_Detection::BlobInfo::width(in_stack_fffffffffffffdb8._8_8_);
      if (uVar2 != in_stack_ffffffffffffff90) goto LAB_00186132;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)&stack0xffffffffffffff70);
      std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::operator[]
                (pvVar3,0);
      uVar2 = Blob_Detection::BlobInfo::height(in_stack_fffffffffffffdb8._8_8_);
      if (uVar2 != in_stack_ffffffffffffff8c) goto LAB_00186132;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)&stack0xffffffffffffff70);
      std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::operator[]
                (pvVar3,0);
      sVar5 = Blob_Detection::BlobInfo::size((BlobInfo *)0x186060);
      if (sVar5 != in_stack_ffffffffffffff90 * in_stack_ffffffffffffff8c) goto LAB_00186132;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)&stack0xffffffffffffff70);
      pvVar6 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               operator[](pvVar3,0);
      pvVar7 = Blob_Detection::BlobInfo::contourX(pvVar6);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
      if (sVar4 != local_158) goto LAB_00186132;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)&stack0xffffffffffffff70);
      pvVar6 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               operator[](pvVar3,0);
      pvVar7 = Blob_Detection::BlobInfo::edgeX(pvVar6);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
      if (sVar4 != local_158) goto LAB_00186132;
      bVar1 = false;
    }
    else {
LAB_00186132:
      local_1 = 0;
      bVar1 = true;
    }
    Blob_Detection::BlobDetection::~BlobDetection((BlobDetection *)0x1861be);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1861cb);
    if (bVar1) goto LAB_00186209;
    local_8 = local_8 + 1;
  }
  local_1 = 1;
LAB_00186209:
  return (bool)(local_1 & 1);
}

Assistant:

bool Detect1Blob()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 1, 256 ) );

            Blob_Detection::BlobDetection detection;
            detection.find( image );

            const uint32_t contour = ((roiWidth > 1) && (roiHeight > 2)) ? (2 * roiWidth + 2 * (roiHeight - 2)) : (roiWidth * roiHeight);

            if( detection().size() != 1 || detection()[0].width() != roiWidth ||
                detection()[0].height() != roiHeight || detection()[0].size() != roiWidth * roiHeight ||
                detection()[0].contourX().size() != contour ||
                detection()[0].edgeX   ().size() != contour )
                return false;
        }

        return true;
    }